

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall cs_impl::any::any<cs::type_id>(any *this,type_id *dat)

{
  holder<cs::type_id> *args_1;
  proxy *ppVar1;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  
  uVar2 = 1;
  args_1 = cs::
           allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::type_id_const&>
                     ((allocator_type<cs_impl::any::holder<cs::type_id>,_64UL,_cs_impl::default_allocator_provider>
                       *)in_RSI,(type_id *)CONCAT44(1,in_stack_ffffffffffffffe8));
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<cs::type_id>*>
                     (in_RSI,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                      (holder<cs::type_id> **)args_1);
  *in_RDI = ppVar1;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}